

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall
smf::MidiFile::writeVLValue
          (MidiFile *this,long aValue,vector<unsigned_char,_std::allocator<unsigned_char>_> *outdata
          )

{
  ostream *this_00;
  bool bVar1;
  int local_2c;
  int local_28;
  int i;
  int start;
  uchar bytes [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *outdata_local;
  long aValue_local;
  MidiFile *this_local;
  
  _start = outdata;
  memset(&i,0,4);
  outdata_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)aValue;
  if (0xfffffff < (ulong)aValue) {
    this_00 = std::operator<<((ostream *)&std::cerr,"Error: number too large to convert to VLV");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    outdata_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xfffffff;
  }
  i._0_1_ = (byte)((ulong)outdata_local >> 0x15) & 0x7f;
  i._1_1_ = (byte)((ulong)outdata_local >> 0xe) & 0x7f;
  i._2_1_ = (byte)((ulong)outdata_local >> 7) & 0x7f;
  i._3_1_ = (byte)outdata_local & 0x7f;
  local_28 = 0;
  while( true ) {
    bVar1 = false;
    if (local_28 < 4) {
      bVar1 = *(char *)((long)&i + (long)local_28) == '\0';
    }
    if (!bVar1) break;
    local_28 = local_28 + 1;
  }
  for (local_2c = local_28; local_2c < 3; local_2c = local_2c + 1) {
    *(byte *)((long)&i + (long)local_2c) = *(byte *)((long)&i + (long)local_2c) | 0x80;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_start,(value_type_conflict2 *)((long)&i + (long)local_2c));
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (_start,(value_type_conflict2 *)((long)&i + 3));
  return;
}

Assistant:

void MidiFile::writeVLValue(long aValue, std::vector<uchar>& outdata) {
	uchar bytes[4] = {0};

	if ((unsigned long)aValue >= (1 << 28)) {
		std::cerr << "Error: number too large to convert to VLV" << std::endl;
		aValue = 0x0FFFffff;
	}

	bytes[0] = (uchar)(((ulong)aValue >> 21) & 0x7f);  // most significant 7 bits
	bytes[1] = (uchar)(((ulong)aValue >> 14) & 0x7f);
	bytes[2] = (uchar)(((ulong)aValue >> 7)  & 0x7f);
	bytes[3] = (uchar)(((ulong)aValue)       & 0x7f);  // least significant 7 bits

	int start = 0;
	while ((start<4) && (bytes[start] == 0))  start++;

	for (int i=start; i<3; i++) {
		bytes[i] = bytes[i] | 0x80;
		outdata.push_back(bytes[i]);
	}
	outdata.push_back(bytes[3]);
}